

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateParseTable
          (MessageGenerator *this,Printer *printer,size_t offset,size_t aux_offset)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  value_type this_00;
  FileDescriptor *file;
  Iterator IVar4;
  value_type field;
  Iterator __end3;
  Iterator __begin3;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3;
  undefined4 local_78;
  int max_field_number;
  undefined1 local_68 [8];
  Formatter format;
  size_t aux_offset_local;
  size_t offset_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = aux_offset;
  aux_offset_local = offset;
  offset_local = (size_t)printer;
  printer_local = (Printer *)this;
  Formatter::Formatter((Formatter *)local_68,printer,&this->variables_);
  if ((this->table_driven_ & 1U) == 0) {
    Formatter::operator()<>
              ((Formatter *)local_68,"{ nullptr, nullptr, 0, -1, -1, -1, -1, nullptr, false },\n");
    this_local._7_1_ = 0;
  }
  else {
    __range3._4_4_ = 0;
    __begin3.descriptor = (Descriptor *)FieldRange<google::protobuf::Descriptor>(this->descriptor_);
    IVar4 = FieldRangeImpl<google::protobuf::Descriptor>::begin
                      ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
    __begin3._0_8_ = IVar4.descriptor;
    __end3.descriptor._0_4_ = IVar4.idx;
    IVar4 = FieldRangeImpl<google::protobuf::Descriptor>::end
                      ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
    __end3._0_8_ = IVar4.descriptor;
    field._0_4_ = IVar4.idx;
    while( true ) {
      bVar1 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&field);
      if (!bVar1) break;
      this_00 = FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                          ((Iterator *)&__end3.descriptor);
      iVar3 = __range3._4_4_;
      iVar2 = FieldDescriptor::number(this_00);
      if (iVar3 < iVar2) {
        __range3._4_4_ = FieldDescriptor::number(this_00);
      }
      FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
                ((Iterator *)&__end3.descriptor);
    }
    Formatter::operator()<>((Formatter *)local_68,"{\n");
    Formatter::Indent((Formatter *)local_68);
    Formatter::operator()
              ((Formatter *)local_68,"$tablename$::entries + $1$,\n$tablename$::aux + $2$,\n$3$,\n",
               &aux_offset_local,&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (int *)((long)&__range3 + 4));
    bVar1 = std::vector<int,_std::allocator<int>_>::empty(&this->has_bit_indices_);
    if (bVar1) {
      Formatter::operator()<>((Formatter *)local_68,"-1,\n");
    }
    else {
      Formatter::operator()<>
                ((Formatter *)local_68,"PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_),\n");
    }
    iVar3 = Descriptor::real_oneof_decl_count(this->descriptor_);
    if (iVar3 < 1) {
      Formatter::operator()<>((Formatter *)local_68,"-1,  // no _oneof_case_\n");
    }
    else {
      Formatter::operator()<>
                ((Formatter *)local_68,"PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_),\n");
    }
    iVar3 = Descriptor::extension_range_count(this->descriptor_);
    if (iVar3 < 1) {
      Formatter::operator()<>((Formatter *)local_68,"-1,  // no _extensions_\n");
    }
    else {
      Formatter::operator()<>
                ((Formatter *)local_68,"PROTOBUF_FIELD_OFFSET($classtype$, _extensions_),\n");
    }
    Formatter::operator()<>
              ((Formatter *)local_68,
               "PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n&$package_ns$::_$classname$_default_instance_,\n"
              );
    file = Descriptor::file(this->descriptor_);
    bVar1 = UseUnknownFieldSet(file,&this->options_);
    if (bVar1) {
      Formatter::operator()<>((Formatter *)local_68,"true,\n");
    }
    else {
      Formatter::operator()<>((Formatter *)local_68,"false,\n");
    }
    Formatter::Outdent((Formatter *)local_68);
    Formatter::operator()<>((Formatter *)local_68,"},\n");
    this_local._7_1_ = 1;
  }
  local_78 = 1;
  Formatter::~Formatter((Formatter *)local_68);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MessageGenerator::GenerateParseTable(io::Printer* printer, size_t offset,
                                          size_t aux_offset) {
  Formatter format(printer, variables_);

  if (!table_driven_) {
    format("{ nullptr, nullptr, 0, -1, -1, -1, -1, nullptr, false },\n");
    return false;
  }

  int max_field_number = 0;
  for (auto field : FieldRange(descriptor_)) {
    if (max_field_number < field->number()) {
      max_field_number = field->number();
    }
  }

  format("{\n");
  format.Indent();

  format(
      "$tablename$::entries + $1$,\n"
      "$tablename$::aux + $2$,\n"
      "$3$,\n",
      offset, aux_offset, max_field_number);

  if (has_bit_indices_.empty()) {
    // If no fields have hasbits, then _has_bits_ does not exist.
    format("-1,\n");
  } else {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_),\n");
  }

  if (descriptor_->real_oneof_decl_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_),\n");
  } else {
    format("-1,  // no _oneof_case_\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _extensions_),\n");
  } else {
    format("-1,  // no _extensions_\n");
  }

  // TODO(ckennelly): Consolidate this with the calculation for
  // AuxiliaryParseTableField.
  format(
      "PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n"
      "&$package_ns$::_$classname$_default_instance_,\n");

  if (UseUnknownFieldSet(descriptor_->file(), options_)) {
    format("true,\n");
  } else {
    format("false,\n");
  }

  format.Outdent();
  format("},\n");
  return true;
}